

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O1

void helper_flushw_sparc64(CPUSPARCState_conflict1 *env)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  
  if (env->cansave == env->nwindows - 2) {
    return;
  }
  if (env->otherwin == 0) {
    uVar1 = (env->wstate & 7) << 2;
  }
  else {
    uVar1 = env->wstate >> 1 & 0x1c | 0x20;
  }
  cpu_raise_exception_ra_sparc64(env,uVar1 | 0x80,unaff_retaddr);
}

Assistant:

void helper_flushw(CPUSPARCState *env)
{
    if (env->cansave != env->nwindows - 2) {
        int tt = TT_SPILL | (env->otherwin != 0
                             ? (TT_WOTHER | ((env->wstate & 0x38) >> 1))
                             : ((env->wstate & 0x7) << 2));
        cpu_raise_exception_ra(env, tt, GETPC());
    }
}